

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_starttls_resp(connectdata *conn,int imapcode,imapstate instate)

{
  SessionHandle *data;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  if (imapcode == 0x4f) {
    data._4_4_ = imap_perform_upgrade_tls(conn);
  }
  else if ((conn->data->set).use_ssl == CURLUSESSL_TRY) {
    data._4_4_ = imap_perform_authentication(conn);
  }
  else {
    Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)(uint)imapcode);
    data._4_4_ = CURLE_USE_SSL_FAILED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_starttls_resp(struct connectdata *conn,
                                         int imapcode,
                                         imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(imapcode != 'O') {
    if(data->set.use_ssl != CURLUSESSL_TRY) {
      failf(data, "STARTTLS denied. %c", imapcode);
      result = CURLE_USE_SSL_FAILED;
    }
    else
      result = imap_perform_authentication(conn);
  }
  else
    result = imap_perform_upgrade_tls(conn);

  return result;
}